

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

int cimg_library::cimg::dialog<unsigned_char>
              (char *title,char *msg,char *button1_label,char *button2_label,char *button3_label,
              char *button4_label,char *button5_label,char *button6_label,CImg<unsigned_char> *logo,
              bool is_centered)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  CImg<unsigned_char> *pCVar7;
  CImgArgumentException *this;
  uint *puVar8;
  CImg<unsigned_char> *pCVar9;
  byte local_6b6;
  char *local_6a0;
  uint local_62c;
  int local_464;
  int l_2;
  CImg<unsigned_char> local_440;
  int local_41c;
  int local_418;
  int clicked;
  int selected;
  int oclicked;
  int oselected;
  bool refresh;
  bool stop_flag;
  CImgDisplay disp;
  int local_2f8;
  int lll;
  uint xbuttons [6];
  CImg<unsigned_char> local_2d8;
  CImg<unsigned_char> local_2b8;
  int local_294;
  uint local_290;
  uint by;
  uint bx;
  uint ty;
  uint tx;
  uint ly;
  uint lx;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint h;
  uint local_264;
  uint local_260;
  int local_25c;
  uint w;
  uint bwall;
  undefined1 local_238 [8];
  CImg<unsigned_char> canvas;
  CImg<unsigned_char> local_1f8;
  CImg<unsigned_char> local_1d8;
  int local_1b4;
  undefined1 local_1b0 [4];
  int ll;
  CImg<unsigned_char> cbutton;
  CImg<unsigned_char> sbutton;
  CImg<unsigned_char> button;
  int l_1;
  uint bh;
  uint bw;
  int l;
  CImg<unsigned_char> local_120;
  CImg<unsigned_char> local_100;
  CImg<unsigned_char> local_e0;
  CImg<unsigned_char> local_c0;
  CImg<unsigned_char> local_a0;
  undefined1 local_80 [8];
  CImgList<unsigned_char> sbuttons;
  undefined1 local_60 [8];
  CImgList<unsigned_char> cbuttons;
  CImgList<unsigned_char> buttons;
  bool is_centered_local;
  char *button4_label_local;
  char *button3_label_local;
  char *button2_label_local;
  char *button1_label_local;
  char *msg_local;
  char *title_local;
  
  CImgList<unsigned_char>::CImgList((CImgList<unsigned_char> *)&cbuttons._data);
  CImgList<unsigned_char>::CImgList((CImgList<unsigned_char> *)local_60);
  CImgList<unsigned_char>::CImgList((CImgList<unsigned_char> *)local_80);
  if (button1_label != (char *)0x0) {
    CImg<unsigned_char>::CImg(&local_a0);
    pCVar7 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                       (&local_a0,0,0,button1_label,"",dialog<unsigned_char>::gray,1.0,0xd);
    CImg<unsigned_char>::move_to<unsigned_char>
              (pCVar7,(CImgList<unsigned_char> *)&cbuttons._data,0xffffffff);
    CImg<unsigned_char>::~CImg(&local_a0);
    if (button2_label != (char *)0x0) {
      CImg<unsigned_char>::CImg(&local_c0);
      pCVar7 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                         (&local_c0,0,0,button2_label,"",dialog<unsigned_char>::gray,1.0,0xd);
      CImg<unsigned_char>::move_to<unsigned_char>
                (pCVar7,(CImgList<unsigned_char> *)&cbuttons._data,0xffffffff);
      CImg<unsigned_char>::~CImg(&local_c0);
      if (button3_label != (char *)0x0) {
        CImg<unsigned_char>::CImg(&local_e0);
        pCVar7 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                           (&local_e0,0,0,button3_label,"",dialog<unsigned_char>::gray,1.0,0xd);
        CImg<unsigned_char>::move_to<unsigned_char>
                  (pCVar7,(CImgList<unsigned_char> *)&cbuttons._data,0xffffffff);
        CImg<unsigned_char>::~CImg(&local_e0);
        if (button4_label != (char *)0x0) {
          CImg<unsigned_char>::CImg(&local_100);
          pCVar7 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                             (&local_100,0,0,button4_label,"",dialog<unsigned_char>::gray,1.0,0xd);
          CImg<unsigned_char>::move_to<unsigned_char>
                    (pCVar7,(CImgList<unsigned_char> *)&cbuttons._data,0xffffffff);
          CImg<unsigned_char>::~CImg(&local_100);
          if (button5_label != (char *)0x0) {
            CImg<unsigned_char>::CImg(&local_120);
            pCVar7 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                               (&local_120,0,0,button5_label,"",dialog<unsigned_char>::gray,1.0,0xd)
            ;
            CImg<unsigned_char>::move_to<unsigned_char>
                      (pCVar7,(CImgList<unsigned_char> *)&cbuttons._data,0xffffffff);
            CImg<unsigned_char>::~CImg(&local_120);
            if (button6_label != (char *)0x0) {
              CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&bw);
              pCVar7 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                                 ((CImg<unsigned_char> *)&bw,0,0,button6_label,"",
                                  dialog<unsigned_char>::gray,1.0,0xd);
              CImg<unsigned_char>::move_to<unsigned_char>
                        (pCVar7,(CImgList<unsigned_char> *)&cbuttons._data,0xffffffff);
              CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&bw);
            }
          }
        }
      }
    }
  }
  if ((int)cbuttons._data == 0) {
    this = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (this,"cimg::dialog(): No buttons have been defined.");
    __cxa_throw(this,&CImgArgumentException::typeinfo,CImgArgumentException::~CImgArgumentException)
    ;
  }
  for (bh = 0; (int)bh < (int)cbuttons._data; bh = bh + 1) {
    pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)&cbuttons._data);
    CImg<unsigned_char>::resize(pCVar7 + (int)bh,-100,-100,1,3,1,0,0.0,0.0,0.0,0.0);
  }
  l_1 = 0;
  button._data._4_4_ = 0;
  for (button._data._0_4_ = 0; (int)button._data < (int)cbuttons._data;
      button._data._0_4_ = (int)button._data + 1) {
    pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)&cbuttons._data);
    puVar8 = std::max<unsigned_int>((uint *)&l_1,&pCVar7[(int)button._data]._width);
    l_1 = *puVar8;
    pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)&cbuttons._data);
    puVar8 = std::max<unsigned_int>
                       ((uint *)((long)&button._data + 4),&pCVar7[(int)button._data]._height);
    button._data._4_4_ = *puVar8;
  }
  l_1 = l_1 + 8;
  button._data._4_4_ = button._data._4_4_ + 8;
  if ((uint)l_1 < 0x40) {
    l_1 = 0x40;
  }
  if (0x80 < (uint)l_1) {
    l_1 = 0x80;
  }
  if (button._data._4_4_ < 0x18) {
    button._data._4_4_ = 0x18;
  }
  if (0x30 < button._data._4_4_) {
    button._data._4_4_ = 0x30;
  }
  CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&sbutton._data,l_1,button._data._4_4_,1,3);
  CImg<unsigned_char>::draw_rectangle<unsigned_char>
            ((CImg<unsigned_char> *)&sbutton._data,0,0,l_1 + -1,button._data._4_4_ - 1,
             dialog<unsigned_char>::gray,1.0);
  pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                     ((CImg<unsigned_char> *)&sbutton._data,0,0,l_1 + -1,0,
                      dialog<unsigned_char>::white,1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar7,0,button._data._4_4_ - 1,0,0,dialog<unsigned_char>::white,1.0,0xffffffff,true);
  pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                     ((CImg<unsigned_char> *)&sbutton._data,l_1 + -1,0,l_1 + -1,
                      button._data._4_4_ - 1,"",1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar7,l_1 + -1,button._data._4_4_ - 1,0,button._data._4_4_ - 1,"",1.0,0xffffffff,true)
  ;
  pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                     ((CImg<unsigned_char> *)&sbutton._data,1,button._data._4_4_ - 2,l_1 + -2,
                      button._data._4_4_ - 2,dialog<unsigned_char>::gray2,1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar7,l_1 + -2,button._data._4_4_ - 2,l_1 + -2,1,dialog<unsigned_char>::gray2,1.0,
             0xffffffff,true);
  CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&cbutton._data,l_1,button._data._4_4_,1,3);
  CImg<unsigned_char>::draw_rectangle<unsigned_char>
            ((CImg<unsigned_char> *)&cbutton._data,0,0,l_1 + -1,button._data._4_4_ - 1,
             dialog<unsigned_char>::gray,1.0);
  pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                     ((CImg<unsigned_char> *)&cbutton._data,0,0,l_1 + -1,0,"",1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar7,l_1 + -1,0,l_1 + -1,button._data._4_4_ - 1,"",1.0,0xffffffff,true);
  pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                     ((CImg<unsigned_char> *)&cbutton._data,l_1 + -1,button._data._4_4_ - 1,0,
                      button._data._4_4_ - 1,"",1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar7,0,button._data._4_4_ - 1,0,0,"",1.0,0xffffffff,true);
  pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                     ((CImg<unsigned_char> *)&cbutton._data,1,1,l_1 + -2,1,
                      dialog<unsigned_char>::white,1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar7,1,button._data._4_4_ - 2,1,1,dialog<unsigned_char>::white,1.0,0xffffffff,true);
  pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                     ((CImg<unsigned_char> *)&cbutton._data,l_1 + -2,1,l_1 + -2,
                      button._data._4_4_ - 2,"",1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar7,l_1 + -2,button._data._4_4_ - 2,1,button._data._4_4_ - 2,"",1.0,0xffffffff,true)
  ;
  pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                     ((CImg<unsigned_char> *)&cbutton._data,2,button._data._4_4_ - 3,l_1 + -3,
                      button._data._4_4_ - 3,dialog<unsigned_char>::gray2,1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar7,l_1 + -3,button._data._4_4_ - 3,l_1 + -3,2,dialog<unsigned_char>::gray2,1.0,
             0xffffffff,true);
  pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                     ((CImg<unsigned_char> *)&cbutton._data,4,4,l_1 + -5,4,"",1.0,0xaaaaaaaa,true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar7,l_1 + -5,4,l_1 + -5,button._data._4_4_ - 5,"",1.0,0xaaaaaaaa,false);
  pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                     ((CImg<unsigned_char> *)&cbutton._data,l_1 + -5,button._data._4_4_ - 5,4,
                      button._data._4_4_ - 5,"",1.0,0xaaaaaaaa,false);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar7,4,button._data._4_4_ - 5,4,4,"",1.0,0xaaaaaaaa,false);
  CImg<unsigned_char>::CImg((CImg<unsigned_char> *)local_1b0,l_1,button._data._4_4_,1,3);
  pCVar7 = CImg<unsigned_char>::draw_rectangle<unsigned_char>
                     ((CImg<unsigned_char> *)local_1b0,0,0,l_1 + -1,button._data._4_4_ - 1,"",1.0);
  pCVar7 = CImg<unsigned_char>::draw_rectangle<unsigned_char>
                     (pCVar7,1,1,l_1 + -2,button._data._4_4_ - 2,dialog<unsigned_char>::gray2,1.0);
  CImg<unsigned_char>::draw_rectangle<unsigned_char>
            (pCVar7,2,2,l_1 + -3,button._data._4_4_ - 3,dialog<unsigned_char>::gray,1.0);
  pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                     ((CImg<unsigned_char> *)local_1b0,4,4,l_1 + -5,4,"",1.0,0xaaaaaaaa,true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar7,l_1 + -5,4,l_1 + -5,button._data._4_4_ - 5,"",1.0,0xaaaaaaaa,false);
  pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                     ((CImg<unsigned_char> *)local_1b0,l_1 + -5,button._data._4_4_ - 5,4,
                      button._data._4_4_ - 5,"",1.0,0xaaaaaaaa,false);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar7,4,button._data._4_4_ - 5,4,4,"",1.0,0xaaaaaaaa,false);
  for (local_1b4 = 0; local_1b4 < (int)cbuttons._data; local_1b4 = local_1b4 + 1) {
    CImg<unsigned_char>::CImg(&local_1d8,(CImg<unsigned_char> *)local_1b0);
    iVar4 = l_1;
    pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)&cbuttons._data);
    iVar2 = CImg<unsigned_char>::width(pCVar7 + local_1b4);
    uVar6 = button._data._4_4_;
    pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)&cbuttons._data);
    iVar3 = CImg<unsigned_char>::height(pCVar7 + local_1b4);
    pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)&cbuttons._data);
    pCVar7 = CImg<unsigned_char>::draw_image<unsigned_char>
                       (&local_1d8,((uint)(iVar4 - iVar2) >> 1) + 1,(uVar6 - iVar3 >> 1) + 1,
                        pCVar7 + local_1b4,1.0);
    CImg<unsigned_char>::move_to<unsigned_char>
              (pCVar7,(CImgList<unsigned_char> *)local_60,0xffffffff);
    CImg<unsigned_char>::~CImg(&local_1d8);
    CImg<unsigned_char>::CImg(&local_1f8,(CImg<unsigned_char> *)&cbutton._data);
    iVar4 = l_1;
    pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)&cbuttons._data);
    iVar2 = CImg<unsigned_char>::width(pCVar7 + local_1b4);
    uVar6 = button._data._4_4_;
    pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)&cbuttons._data);
    iVar3 = CImg<unsigned_char>::height(pCVar7 + local_1b4);
    pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)&cbuttons._data);
    pCVar7 = CImg<unsigned_char>::draw_image<unsigned_char>
                       (&local_1f8,(uint)(iVar4 - iVar2) >> 1,uVar6 - iVar3 >> 1,pCVar7 + local_1b4,
                        1.0);
    CImg<unsigned_char>::move_to<unsigned_char>
              (pCVar7,(CImgList<unsigned_char> *)local_80,0xffffffff);
    CImg<unsigned_char>::~CImg(&local_1f8);
    CImg<unsigned_char>::CImg
              ((CImg<unsigned_char> *)&canvas._data,(CImg<unsigned_char> *)&sbutton._data);
    iVar4 = l_1;
    pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)&cbuttons._data);
    iVar2 = CImg<unsigned_char>::width(pCVar7 + local_1b4);
    uVar6 = button._data._4_4_;
    pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)&cbuttons._data);
    iVar3 = CImg<unsigned_char>::height(pCVar7 + local_1b4);
    pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)&cbuttons._data);
    pCVar7 = CImg<unsigned_char>::draw_image<unsigned_char>
                       ((CImg<unsigned_char> *)&canvas._data,(uint)(iVar4 - iVar2) >> 1,
                        uVar6 - iVar3 >> 1,pCVar7 + local_1b4,1.0);
    pCVar9 = CImgList::operator_cast_to_CImg_((CImgList *)&cbuttons._data);
    CImg<unsigned_char>::move_to(pCVar7,pCVar9 + local_1b4);
    CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&canvas._data);
  }
  CImg<unsigned_char>::CImg((CImg<unsigned_char> *)local_238);
  if (msg != (char *)0x0) {
    CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&w);
    pCVar7 = CImg<unsigned_char>::draw_text<unsigned_char>
                       ((CImg<unsigned_char> *)&w,0,0,"%s",dialog<unsigned_char>::gray,0,1.0,0xd,msg
                       );
    pCVar7 = CImg<unsigned_char>::operator*=(pCVar7,-1);
    pCVar7 = CImg<unsigned_char>::operator+=(pCVar7,200);
    pCVar7 = CImg<unsigned_char>::resize(pCVar7,-100,-100,1,3,1,0,0.0,0.0,0.0,0.0);
    CImg<unsigned_char>::move_to(pCVar7,(CImg<unsigned_char> *)local_238);
    CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&w);
  }
  local_25c = ((int)cbuttons._data + -1) * (l_1 + 0xc) + l_1;
  local_264 = 0xc4;
  h = logo->_width + 0x24 + local_238._0_4_;
  local_26c = local_25c + 0x18;
  local_260 = max<unsigned_int>(&local_264,&h,&local_26c);
  local_274 = 0x60;
  lx = local_238._4_4_ + 0x24 + button._data._4_4_;
  ly = logo->_height + 0x24 + button._data._4_4_;
  local_270 = max<unsigned_int>(&local_274,&lx,&ly);
  if (canvas._16_8_ == 0) {
    local_62c = (local_260 - 0x18) - logo->_width >> 1;
  }
  else {
    local_62c = 0;
  }
  tx = local_62c + 0xc;
  ty = ((local_270 - 0xc) - button._data._4_4_) - logo->_height >> 1;
  bx = tx + logo->_width + 0xc;
  by = ((local_270 - 0xc) - button._data._4_4_) - local_238._4_4_ >> 1;
  local_290 = local_260 - local_25c >> 1;
  local_294 = (local_270 - 0xc) - button._data._4_4_;
  if (canvas._16_8_ == 0) {
    CImg<unsigned_char>::CImg(&local_2d8,local_260,local_270,1,3);
    pCVar7 = CImg<unsigned_char>::draw_rectangle<unsigned_char>
                       (&local_2d8,0,0,local_260 - 1,local_270 - 1,dialog<unsigned_char>::gray,1.0);
    pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar7,0,0,local_260 - 1,0,dialog<unsigned_char>::white,1.0,0xffffffff,true)
    ;
    pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar7,0,local_270 - 1,0,0,dialog<unsigned_char>::white,1.0,0xffffffff,true)
    ;
    pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar7,local_260 - 1,0,local_260 - 1,local_270 - 1,"",1.0,0xffffffff,true);
    pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar7,local_260 - 1,local_270 - 1,0,local_270 - 1,"",1.0,0xffffffff,true);
    CImg<unsigned_char>::operator=((CImg<unsigned_char> *)local_238,pCVar7);
    CImg<unsigned_char>::~CImg(&local_2d8);
  }
  else {
    CImg<unsigned_char>::CImg(&local_2b8,local_260,local_270,1,3);
    pCVar7 = CImg<unsigned_char>::draw_rectangle<unsigned_char>
                       (&local_2b8,0,0,local_260 - 1,local_270 - 1,dialog<unsigned_char>::gray,1.0);
    pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar7,0,0,local_260 - 1,0,dialog<unsigned_char>::white,1.0,0xffffffff,true)
    ;
    pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar7,0,local_270 - 1,0,0,dialog<unsigned_char>::white,1.0,0xffffffff,true)
    ;
    pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar7,local_260 - 1,0,local_260 - 1,local_270 - 1,"",1.0,0xffffffff,true);
    pCVar7 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar7,local_260 - 1,local_270 - 1,0,local_270 - 1,"",1.0,0xffffffff,true);
    pCVar7 = CImg<unsigned_char>::draw_image<unsigned_char>
                       (pCVar7,bx,by,(CImg<unsigned_char> *)local_238,1.0);
    CImg<unsigned_char>::operator=((CImg<unsigned_char> *)local_238,pCVar7);
    CImg<unsigned_char>::~CImg(&local_2b8);
  }
  if (logo->_data != (uchar *)0x0) {
    CImg<unsigned_char>::draw_image<unsigned_char>((CImg<unsigned_char> *)local_238,tx,ty,logo,1.0);
  }
  memset(&local_2f8,0,0x18);
  for (disp._data._4_4_ = 0; disp._data._4_4_ < (int)cbuttons._data;
      disp._data._4_4_ = disp._data._4_4_ + 1) {
    (&local_2f8)[disp._data._4_4_] = local_290 + (l_1 + 0xc) * disp._data._4_4_;
    iVar2 = local_294;
    iVar4 = (&local_2f8)[disp._data._4_4_];
    pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)&cbuttons._data);
    CImg<unsigned_char>::draw_image<unsigned_char>
              ((CImg<unsigned_char> *)local_238,iVar4,iVar2,pCVar7 + disp._data._4_4_,1.0);
  }
  local_6a0 = title;
  if (title == (char *)0x0) {
    local_6a0 = " ";
  }
  CImgDisplay::CImgDisplay<unsigned_char>
            ((CImgDisplay *)&oselected,(CImg<unsigned_char> *)local_238,local_6a0,0,false,
             is_centered);
  if (is_centered) {
    iVar4 = CImgDisplay::screen_width();
    iVar2 = CImgDisplay::width((CImgDisplay *)&oselected);
    iVar3 = CImgDisplay::screen_height();
    iVar5 = CImgDisplay::height((CImgDisplay *)&oselected);
    CImgDisplay::move((CImgDisplay *)&oselected,(iVar4 - iVar2) / 2,(iVar3 - iVar5) / 2);
  }
  oclicked._3_1_ = 0;
  oclicked._2_1_ = 0;
  selected = -1;
  clicked = -1;
  local_418 = -1;
  local_41c = -1;
  do {
    do {
      bVar1 = CImgDisplay::is_closed((CImgDisplay *)&oselected);
      local_6b6 = 0;
      if (!bVar1) {
        local_6b6 = oclicked._3_1_ ^ 0xff;
      }
      if ((local_6b6 & 1) == 0) {
        bVar1 = CImgDisplay::operator_cast_to_bool((CImgDisplay *)&oselected);
        if (!bVar1) {
          local_418 = -1;
        }
        iVar4 = local_418;
        CImgDisplay::~CImgDisplay((CImgDisplay *)&oselected);
        CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)local_238);
        CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)local_1b0);
        CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&cbutton._data);
        CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&sbutton._data);
        CImgList<unsigned_char>::~CImgList((CImgList<unsigned_char> *)local_80);
        CImgList<unsigned_char>::~CImgList((CImgList<unsigned_char> *)local_60);
        CImgList<unsigned_char>::~CImgList((CImgList<unsigned_char> *)&cbuttons._data);
        return iVar4;
      }
      if ((oclicked._2_1_ & 1) != 0) {
        if (local_41c < 0) {
          if (local_418 < 0) {
            CImg<unsigned_char>::display((CImg<unsigned_char> *)local_238,(CImgDisplay *)&oselected)
            ;
          }
          else {
            CImg<unsigned_char>::CImg
                      ((CImg<unsigned_char> *)&stack0xfffffffffffffba0,
                       (CImg<unsigned_char> *)local_238);
            iVar2 = local_294;
            iVar4 = (&local_2f8)[local_418];
            pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)local_80);
            pCVar7 = CImg<unsigned_char>::draw_image<unsigned_char>
                               ((CImg<unsigned_char> *)&stack0xfffffffffffffba0,iVar4,iVar2,
                                pCVar7 + local_418,1.0);
            CImg<unsigned_char>::display(pCVar7,(CImgDisplay *)&oselected);
            CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&stack0xfffffffffffffba0);
          }
        }
        else {
          CImg<unsigned_char>::CImg(&local_440,(CImg<unsigned_char> *)local_238);
          iVar2 = local_294;
          iVar4 = (&local_2f8)[local_41c];
          pCVar7 = CImgList::operator_cast_to_CImg_((CImgList *)local_60);
          pCVar7 = CImg<unsigned_char>::draw_image<unsigned_char>
                             (&local_440,iVar4,iVar2,pCVar7 + local_41c,1.0);
          CImg<unsigned_char>::display(pCVar7,(CImgDisplay *)&oselected);
          CImg<unsigned_char>::~CImg(&local_440);
        }
        oclicked._2_1_ = 0;
      }
      CImgDisplay::wait((CImgDisplay *)&oselected,(void *)0xf);
      bVar1 = CImgDisplay::is_resized((CImgDisplay *)&oselected);
      if (bVar1) {
        CImgDisplay::resize((CImgDisplay *)&oselected,(CImgDisplay *)&oselected,false);
      }
      uVar6 = CImgDisplay::button((CImgDisplay *)&oselected);
      if ((uVar6 & 1) == 0) {
        if (-1 < local_41c) {
          oclicked._3_1_ = 1;
        }
      }
      else {
        clicked = local_41c;
        local_41c = -1;
        for (local_464 = 0; local_464 < (int)cbuttons._data; local_464 = local_464 + 1) {
          iVar4 = CImgDisplay::mouse_y((CImgDisplay *)&oselected);
          if ((((local_294 <= iVar4) &&
               (iVar4 = CImgDisplay::mouse_y((CImgDisplay *)&oselected),
               iVar4 < (int)(local_294 + button._data._4_4_))) &&
              (iVar4 = CImgDisplay::mouse_x((CImgDisplay *)&oselected),
              (&local_2f8)[local_464] <= iVar4)) &&
             (iVar4 = CImgDisplay::mouse_x((CImgDisplay *)&oselected),
             iVar4 < (&local_2f8)[local_464] + l_1)) {
            local_418 = local_464;
            local_41c = local_464;
            oclicked._2_1_ = 1;
          }
        }
        if (local_41c != clicked) {
          oclicked._2_1_ = 1;
        }
      }
      uVar6 = CImgDisplay::key((CImgDisplay *)&oselected,0);
    } while (uVar6 == 0);
    selected = local_418;
    uVar6 = CImgDisplay::key((CImgDisplay *)&oselected,0);
    iVar4 = local_418;
    if (uVar6 == 0xff09) {
LAB_001b19d3:
      iVar4 = local_418 + 1;
      local_418 = CImgList<unsigned_char>::width((CImgList<unsigned_char> *)&cbuttons._data);
      local_418 = iVar4 % local_418;
    }
    else if (uVar6 == 0xff0d) {
      if (local_418 < 0) {
        local_418 = 0;
      }
      oclicked._3_1_ = 1;
    }
    else if (uVar6 == 0xff1b) {
      local_418 = -1;
      oclicked._3_1_ = 1;
    }
    else if (uVar6 - 0xff51 < 2) {
      iVar2 = CImgList<unsigned_char>::width((CImgList<unsigned_char> *)&cbuttons._data);
      local_418 = CImgList<unsigned_char>::width((CImgList<unsigned_char> *)&cbuttons._data);
      local_418 = (iVar4 + -1 + iVar2) % local_418;
    }
    else if (uVar6 - 0xff53 < 2) goto LAB_001b19d3;
    CImgDisplay::set_key((CImgDisplay *)&oselected);
    if (local_418 != selected) {
      oclicked._2_1_ = 1;
    }
  } while( true );
}

Assistant:

inline int dialog(const char *const title, const char *const msg,
                      const char *const button1_label, const char *const button2_label,
                      const char *const button3_label, const char *const button4_label,
                      const char *const button5_label, const char *const button6_label,
                      const CImg<t>& logo, const bool is_centered=false) {
#if cimg_display==0
      cimg::unused(title,msg,button1_label,button2_label,button3_label,button4_label,button5_label,button6_label,
                   logo._data,is_centered);
      throw CImgIOException("cimg::dialog(): No display available.");
#else
      static const unsigned char
        black[] = { 0,0,0 }, white[] = { 255,255,255 }, gray[] = { 200,200,200 }, gray2[] = { 150,150,150 };

      // Create buttons and canvas graphics
      CImgList<unsigned char> buttons, cbuttons, sbuttons;
      if (button1_label) {
        CImg<unsigned char>().draw_text(0,0,button1_label,black,gray,1,13).move_to(buttons);
        if (button2_label) {
          CImg<unsigned char>().draw_text(0,0,button2_label,black,gray,1,13).move_to(buttons);
          if (button3_label) {
            CImg<unsigned char>().draw_text(0,0,button3_label,black,gray,1,13).move_to(buttons);
            if (button4_label) {
              CImg<unsigned char>().draw_text(0,0,button4_label,black,gray,1,13).move_to(buttons);
              if (button5_label) {
                CImg<unsigned char>().draw_text(0,0,button5_label,black,gray,1,13).move_to(buttons);
                if (button6_label) {
                  CImg<unsigned char>().draw_text(0,0,button6_label,black,gray,1,13).move_to(buttons);
                }}}}}}
      if (!buttons._width)
        throw CImgArgumentException("cimg::dialog(): No buttons have been defined.");
      cimglist_for(buttons,l) buttons[l].resize(-100,-100,1,3);

      unsigned int bw = 0, bh = 0;
      cimglist_for(buttons,l) { bw = std::max(bw,buttons[l]._width); bh = std::max(bh,buttons[l]._height); }
      bw+=8; bh+=8;
      if (bw<64) bw = 64;
      if (bw>128) bw = 128;
      if (bh<24) bh = 24;
      if (bh>48) bh = 48;

      CImg<unsigned char> button(bw,bh,1,3);
      button.draw_rectangle(0,0,bw - 1,bh - 1,gray);
      button.draw_line(0,0,bw - 1,0,white).draw_line(0,bh - 1,0,0,white);
      button.draw_line(bw - 1,0,bw - 1,bh - 1,black).draw_line(bw - 1,bh - 1,0,bh - 1,black);
      button.draw_line(1,bh - 2,bw - 2,bh - 2,gray2).draw_line(bw - 2,bh - 2,bw - 2,1,gray2);
      CImg<unsigned char> sbutton(bw,bh,1,3);
      sbutton.draw_rectangle(0,0,bw - 1,bh - 1,gray);
      sbutton.draw_line(0,0,bw - 1,0,black).draw_line(bw - 1,0,bw - 1,bh - 1,black);
      sbutton.draw_line(bw - 1,bh - 1,0,bh - 1,black).draw_line(0,bh - 1,0,0,black);
      sbutton.draw_line(1,1,bw - 2,1,white).draw_line(1,bh - 2,1,1,white);
      sbutton.draw_line(bw - 2,1,bw - 2,bh - 2,black).draw_line(bw - 2,bh - 2,1,bh - 2,black);
      sbutton.draw_line(2,bh - 3,bw - 3,bh - 3,gray2).draw_line(bw - 3,bh - 3,bw - 3,2,gray2);
      sbutton.draw_line(4,4,bw - 5,4,black,1,0xAAAAAAAA,true).
        draw_line(bw - 5,4,bw - 5,bh - 5,black,1,0xAAAAAAAA,false);
      sbutton.draw_line(bw - 5,bh - 5,4,bh - 5,black,1,0xAAAAAAAA,false).
        draw_line(4,bh - 5,4,4,black,1,0xAAAAAAAA,false);
      CImg<unsigned char> cbutton(bw,bh,1,3);
      cbutton.draw_rectangle(0,0,bw - 1,bh - 1,black).draw_rectangle(1,1,bw - 2,bh - 2,gray2).
        draw_rectangle(2,2,bw - 3,bh - 3,gray);
      cbutton.draw_line(4,4,bw - 5,4,black,1,0xAAAAAAAA,true).
        draw_line(bw - 5,4,bw - 5,bh - 5,black,1,0xAAAAAAAA,false);
      cbutton.draw_line(bw - 5,bh - 5,4,bh - 5,black,1,0xAAAAAAAA,false).
        draw_line(4,bh - 5,4,4,black,1,0xAAAAAAAA,false);

      cimglist_for(buttons,ll) {
        CImg<unsigned char>(cbutton).
          draw_image(1 + (bw  -buttons[ll].width())/2,1 + (bh - buttons[ll].height())/2,buttons[ll]).
          move_to(cbuttons);
        CImg<unsigned char>(sbutton).
          draw_image((bw - buttons[ll].width())/2,(bh - buttons[ll].height())/2,buttons[ll]).
          move_to(sbuttons);
        CImg<unsigned char>(button).
          draw_image((bw - buttons[ll].width())/2,(bh - buttons[ll].height())/2,buttons[ll]).
          move_to(buttons[ll]);
      }

      CImg<unsigned char> canvas;
      if (msg)
        ((CImg<unsigned char>().draw_text(0,0,"%s",gray,0,1,13,msg)*=-1)+=200).resize(-100,-100,1,3).move_to(canvas);

      const unsigned int
        bwall = (buttons._width - 1)*(12 + bw) + bw,
        w = cimg::max(196U,36 + logo._width + canvas._width,24 + bwall),
        h = cimg::max(96U,36 + canvas._height + bh,36 + logo._height + bh),
        lx = 12 + (canvas._data?0:((w - 24 - logo._width)/2)),
        ly = (h - 12 - bh - logo._height)/2,
        tx = lx + logo._width + 12,
        ty = (h - 12 - bh - canvas._height)/2,
        bx = (w - bwall)/2,
        by = h - 12 - bh;

      if (canvas._data)
        canvas = CImg<unsigned char>(w,h,1,3).
          draw_rectangle(0,0,w - 1,h - 1,gray).
          draw_line(0,0,w - 1,0,white).draw_line(0,h - 1,0,0,white).
          draw_line(w - 1,0,w - 1,h - 1,black).draw_line(w - 1,h - 1,0,h - 1,black).
          draw_image(tx,ty,canvas);
      else
        canvas = CImg<unsigned char>(w,h,1,3).
          draw_rectangle(0,0,w - 1,h - 1,gray).
          draw_line(0,0,w - 1,0,white).draw_line(0,h - 1,0,0,white).
          draw_line(w - 1,0,w - 1,h - 1,black).draw_line(w - 1,h - 1,0,h - 1,black);
      if (logo._data) canvas.draw_image(lx,ly,logo);

      unsigned int xbuttons[6] = { 0 };
      cimglist_for(buttons,lll) {
        xbuttons[lll] = bx + (bw + 12)*lll;
        canvas.draw_image(xbuttons[lll],by,buttons[lll]);
      }

      // Open window and enter events loop
      CImgDisplay disp(canvas,title?title:" ",0,false,is_centered?true:false);
      if (is_centered) disp.move((CImgDisplay::screen_width() - disp.width())/2,
                                 (CImgDisplay::screen_height() - disp.height())/2);
      bool stop_flag = false, refresh = false;
      int oselected = -1, oclicked = -1, selected = -1, clicked = -1;
      while (!disp.is_closed() && !stop_flag) {
        if (refresh) {
          if (clicked>=0)
            CImg<unsigned char>(canvas).draw_image(xbuttons[clicked],by,cbuttons[clicked]).display(disp);
          else {
            if (selected>=0)
              CImg<unsigned char>(canvas).draw_image(xbuttons[selected],by,sbuttons[selected]).display(disp);
            else canvas.display(disp);
          }
          refresh = false;
        }
        disp.wait(15);
        if (disp.is_resized()) disp.resize(disp,false);

        if (disp.button()&1)  {
          oclicked = clicked;
          clicked = -1;
          cimglist_for(buttons,l)
            if (disp.mouse_y()>=(int)by && disp.mouse_y()<(int)(by + bh) &&
                disp.mouse_x()>=(int)xbuttons[l] && disp.mouse_x()<(int)(xbuttons[l] + bw)) {
              clicked = selected = l;
              refresh = true;
            }
          if (clicked!=oclicked) refresh = true;
        } else if (clicked>=0) stop_flag = true;

        if (disp.key()) {
          oselected = selected;
          switch (disp.key()) {
          case cimg::keyESC : selected = -1; stop_flag = true; break;
          case cimg::keyENTER : if (selected<0) selected = 0; stop_flag = true; break;
          case cimg::keyTAB :
          case cimg::keyARROWRIGHT :
          case cimg::keyARROWDOWN : selected = (selected + 1)%buttons.width(); break;
          case cimg::keyARROWLEFT :
          case cimg::keyARROWUP : selected = (selected + buttons.width() - 1)%buttons.width(); break;
          }
          disp.set_key();
          if (selected!=oselected) refresh = true;
        }
      }
      if (!disp) selected = -1;
      return selected;
#endif
    }